

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManChoiceLevel_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int Fill;
  uint Fill_00;
  uint extraout_EDX_01;
  int Fill_01;
  uint Fill_02;
  uint extraout_EDX_02;
  int Fill_03;
  int Fill_04;
  int Fill_05;
  int Fill_06;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  int local_40;
  
  pGVar12 = p->pObjs;
  if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006b5f13;
  iVar2 = (int)((long)pObj - (long)pGVar12 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar4 = p->nTravIds;
  if (p->pTravIds[iVar2] == uVar4) {
    return;
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  p->pTravIds[iVar2] = uVar4;
  uVar11 = *(ulong *)pObj;
  uVar10 = (uint)uVar11;
  if ((~uVar10 & 0x9fffffff) == 0) {
    local_40 = 0;
    if ((p_00 != (Tim_Man_t *)0x0) &&
       (iVar2 = Tim_ManBoxForCi(p_00,(uint)(uVar11 >> 0x20) & 0x1fffffff), uVar4 = extraout_EDX,
       -1 < iVar2)) {
      iVar3 = Tim_ManBoxInputFirst(p_00,iVar2);
      uVar4 = Tim_ManBoxInputNum(p_00,iVar2);
      if ((int)uVar4 < 1) {
        local_40 = 1;
        uVar4 = extraout_EDX_00;
      }
      else {
        lVar9 = (long)iVar3;
        uVar11 = (ulong)uVar4;
        local_40 = 0;
        do {
          if ((iVar3 < 0) || (p->vCos->nSize <= lVar9)) goto LAB_006b5ef4;
          iVar2 = p->vCos->pArray[lVar9];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_006b5f32;
          pGVar8 = p->pObjs + iVar2;
          Gia_ManChoiceLevel_rec(p,pGVar8);
          pGVar12 = p->pObjs;
          if ((pGVar8 < pGVar12) || (pGVar12 + p->nObjs <= pGVar8)) goto LAB_006b5f13;
          uVar10 = (int)((long)pGVar8 - (long)pGVar12 >> 2) * -0x55555555;
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,uVar10 + 1,Fill);
          if (((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) goto LAB_006b5ef4;
          uVar4 = Fill_00;
          if (local_40 < pVVar1->pArray[uVar10 & 0x7fffffff]) {
            pGVar12 = p->pObjs;
            if ((pGVar8 < pGVar12) || (pGVar12 + p->nObjs <= pGVar8)) goto LAB_006b5f13;
            uVar4 = (int)((long)pGVar8 - (long)pGVar12 >> 2) * -0x55555555;
            pVVar1 = p->vLevels;
            Vec_IntFillExtra(pVVar1,uVar4 + 1,Fill_00);
            if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) goto LAB_006b5ef4;
            local_40 = pVVar1->pArray[uVar4 & 0x7fffffff];
            uVar4 = extraout_EDX_01;
          }
          lVar9 = lVar9 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        local_40 = local_40 + 1;
      }
    }
  }
  else {
    uVar5 = uVar11 & 0x1fffffff;
    if (uVar5 == 0x1fffffff || -1 < (int)uVar10) {
      bVar6 = (int)uVar10 < 0 || (int)uVar5 == 0x1fffffff;
      uVar4 = (uint)CONCAT71(0x1fffff,bVar6);
      if (bVar6) {
        if ((~uVar11 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x2c1,"void Gia_ManChoiceLevel_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
LAB_006b5cbb:
        local_40 = 0;
      }
      else {
        pGVar12 = pObj + -uVar5;
        Gia_ManChoiceLevel_rec(p,pGVar12);
        pGVar8 = p->pObjs;
        if ((pGVar12 < pGVar8) || (pGVar8 + p->nObjs <= pGVar12)) goto LAB_006b5f13;
        uVar4 = (int)((long)pGVar12 - (long)pGVar8 >> 2) * -0x55555555;
        pVVar1 = p->vLevels;
        Vec_IntFillExtra(pVVar1,uVar4 + 1,Fill_03);
        if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) goto LAB_006b5ef4;
        if (pVVar1->pArray[uVar4 & 0x7fffffff] < 1) {
          local_40 = 0;
        }
        else {
          pGVar8 = p->pObjs;
          if ((pGVar12 < pGVar8) || (pGVar8 + p->nObjs <= pGVar12)) goto LAB_006b5f13;
          uVar4 = (int)((long)pGVar12 - (long)pGVar8 >> 2) * -0x55555555;
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,uVar4 + 1,Fill_04);
          if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) goto LAB_006b5ef4;
          local_40 = pVVar1->pArray[uVar4 & 0x7fffffff];
        }
        pGVar12 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
        Gia_ManChoiceLevel_rec(p,pGVar12);
        pGVar8 = p->pObjs;
        if ((pGVar12 < pGVar8) || (pGVar8 + p->nObjs <= pGVar12)) goto LAB_006b5f13;
        uVar4 = (int)((long)pGVar12 - (long)pGVar8 >> 2) * -0x55555555;
        pVVar1 = p->vLevels;
        Vec_IntFillExtra(pVVar1,uVar4 + 1,Fill_05);
        if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) goto LAB_006b5ef4;
        if (local_40 < pVVar1->pArray[uVar4 & 0x7fffffff]) {
          local_40 = Gia_ObjLevel(p,pGVar12);
        }
        pGVar12 = p->pObjs;
        if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006b5f13;
        piVar7 = p->pSibls;
        if (piVar7 == (int *)0x0) {
LAB_006b5de1:
          uVar4 = (uint)piVar7;
          pGVar12 = (Gia_Obj_t *)0x0;
        }
        else {
          uVar4 = piVar7[(int)((ulong)((long)pObj - (long)pGVar12) >> 2) * -0x55555555];
          piVar7 = (int *)(ulong)uVar4;
          if (piVar7 == (int *)0x0) goto LAB_006b5de1;
          if (((int)uVar4 < 0) || (p->nObjs <= (int)uVar4)) {
LAB_006b5f32:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar12 = pGVar12 + (long)piVar7;
        }
        local_40 = local_40 + 1;
        if (pGVar12 != (Gia_Obj_t *)0x0) {
          Gia_ManChoiceLevel_rec(p,pGVar12);
          pGVar8 = p->pObjs;
          if ((pGVar12 < pGVar8) || (pGVar8 + p->nObjs <= pGVar12)) goto LAB_006b5f13;
          uVar10 = (int)((long)pGVar12 - (long)pGVar8 >> 2) * -0x55555555;
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,uVar10 + 1,Fill_06);
          if (((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) {
LAB_006b5ef4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar4 = extraout_EDX_03;
          if (local_40 < pVVar1->pArray[uVar10 & 0x7fffffff]) {
            local_40 = Gia_ObjLevel(p,pGVar12);
            uVar4 = extraout_EDX_04;
          }
        }
      }
    }
    else {
      pGVar12 = pObj + -uVar5;
      Gia_ManChoiceLevel_rec(p,pGVar12);
      pGVar8 = p->pObjs;
      if ((pGVar12 < pGVar8) || (pGVar8 + p->nObjs <= pGVar12)) goto LAB_006b5f13;
      uVar10 = (int)((long)pGVar12 - (long)pGVar8 >> 2) * -0x55555555;
      pVVar1 = p->vLevels;
      Vec_IntFillExtra(pVVar1,uVar10 + 1,Fill_01);
      if (((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) goto LAB_006b5ef4;
      uVar4 = Fill_02;
      if (pVVar1->pArray[uVar10 & 0x7fffffff] < 1) goto LAB_006b5cbb;
      pGVar8 = p->pObjs;
      if ((pGVar12 < pGVar8) || (pGVar8 + p->nObjs <= pGVar12)) goto LAB_006b5f13;
      uVar4 = (int)((long)pGVar12 - (long)pGVar8 >> 2) * -0x55555555;
      pVVar1 = p->vLevels;
      Vec_IntFillExtra(pVVar1,uVar4 + 1,Fill_02);
      if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) goto LAB_006b5ef4;
      local_40 = pVVar1->pArray[uVar4 & 0x7fffffff];
      uVar4 = extraout_EDX_02;
    }
  }
  pGVar12 = p->pObjs;
  if ((pGVar12 <= pObj) && (pObj < pGVar12 + p->nObjs)) {
    uVar10 = (int)((long)pObj - (long)pGVar12 >> 2) * -0x55555555;
    pVVar1 = p->vLevels;
    Vec_IntFillExtra(pVVar1,uVar10 + 1,uVar4);
    if ((-1 < (int)uVar10) && ((int)uVar10 < pVVar1->nSize)) {
      pVVar1->pArray[uVar10 & 0x7fffffff] = local_40;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_006b5f13:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManChoiceLevel_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Gia_ManCo( p, iTerm1 + i );
                    Gia_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Gia_ObjLevel(p, pNext) )
                        LevelMax = Gia_ObjLevel(p, pNext);
                }
                LevelMax++;
            }
        }
//        Abc_Print( 1, "%d ", pObj->Level );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        pNext = Gia_ObjFanin1(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( (pNext = Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))) )
        {
            Gia_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Gia_ObjLevel(p, pNext) )
                LevelMax = Gia_ObjLevel(p, pNext);
        }
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
    Gia_ObjSetLevel( p, pObj, LevelMax );
}